

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O3

int png_user_version_check(png_structrp png_ptr,png_const_charp user_png_ver)

{
  byte *pbVar1;
  char cVar2;
  long lVar3;
  size_t sVar4;
  int found_dots;
  uint uVar5;
  char m [128];
  char acStack_a8 [136];
  
  if (user_png_ver == (png_const_charp)0x0) {
    pbVar1 = (byte *)((long)&png_ptr->flags + 2);
    *pbVar1 = *pbVar1 | 2;
  }
  else {
    lVar3 = 0;
    uVar5 = 0;
    do {
      cVar2 = user_png_ver[lVar3];
      if (cVar2 != "1.6.36"[lVar3]) {
        pbVar1 = (byte *)((long)&png_ptr->flags + 2);
        *pbVar1 = *pbVar1 | 2;
      }
      uVar5 = uVar5 + (cVar2 == '.');
    } while (((uVar5 < 2) && (lVar3 != 6)) && (lVar3 = lVar3 + 1, cVar2 != '\0'));
    if ((png_ptr->flags & 0x20000) == 0) {
      return 1;
    }
  }
  sVar4 = png_safecat(acStack_a8,0x80,0,"Application built with libpng-");
  sVar4 = png_safecat(acStack_a8,0x80,sVar4,user_png_ver);
  sVar4 = png_safecat(acStack_a8,0x80,sVar4," but running with ");
  png_safecat(acStack_a8,0x80,sVar4,"1.6.36");
  png_warning(png_ptr,acStack_a8);
  return 0;
}

Assistant:

int
png_user_version_check(png_structrp png_ptr, png_const_charp user_png_ver)
{
   /* Libpng versions 1.0.0 and later are binary compatible if the version
    * string matches through the second '.'; we must recompile any
    * applications that use any older library version.
    */

   if (user_png_ver != NULL)
   {
      int i = -1;
      int found_dots = 0;

      do
      {
         i++;
         if (user_png_ver[i] != PNG_LIBPNG_VER_STRING[i])
            png_ptr->flags |= PNG_FLAG_LIBRARY_MISMATCH;
         if (user_png_ver[i] == '.')
            found_dots++;
      } while (found_dots < 2 && user_png_ver[i] != 0 &&
            PNG_LIBPNG_VER_STRING[i] != 0);
   }

   else
      png_ptr->flags |= PNG_FLAG_LIBRARY_MISMATCH;

   if ((png_ptr->flags & PNG_FLAG_LIBRARY_MISMATCH) != 0)
   {
#ifdef PNG_WARNINGS_SUPPORTED
      size_t pos = 0;
      char m[128];

      pos = png_safecat(m, (sizeof m), pos,
          "Application built with libpng-");
      pos = png_safecat(m, (sizeof m), pos, user_png_ver);
      pos = png_safecat(m, (sizeof m), pos, " but running with ");
      pos = png_safecat(m, (sizeof m), pos, PNG_LIBPNG_VER_STRING);
      PNG_UNUSED(pos)

      png_warning(png_ptr, m);
#endif

#ifdef PNG_ERROR_NUMBERS_SUPPORTED
      png_ptr->flags = 0;
#endif

      return 0;
   }

   /* Success return. */
   return 1;
}